

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monmove.c
# Opt level: O3

int dochug(monst *mtmp)

{
  undefined1 *puVar1;
  char cVar2;
  permonst *ptr;
  monst *pmVar3;
  permonst *ppVar4;
  boolean bVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  char *pcVar11;
  char *pcVar12;
  long lVar13;
  obj *poVar14;
  obj *poVar15;
  long amount;
  ulong uVar16;
  monst *mon;
  bool bVar17;
  bool bVar18;
  int scared;
  int nearby;
  int inrange;
  int x;
  musable musable;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  permonst *local_68;
  permonst *local_60;
  musable local_58;
  
  uVar6 = mtmp->mstrategy;
  if ((uVar6 >> 0x1e & 1) != 0) {
    uVar6 = uVar6 & 0xbfffffff;
    mtmp->mstrategy = uVar6;
  }
  ptr = mtmp->data;
  if (((uVar6 >> 0x1d & 1) != 0) &&
     ((((((youmonst.data != mons + 0x7b && youmonst.data != mons + 0x9e) &&
          (u.uprops[0xd].extrinsic == 0 && u.uprops[0xd].intrinsic == 0) ||
         (u.uprops[0xd].blocked != 0)) || ((ptr->mflags1 & 0x1000000) != 0)) &&
       ((((u._1052_1_ & 0x22) == 0 && ((mtmp->field_0x61 & 2) == 0)) &&
        ((viz_array[mtmp->my][mtmp->mx] & 1U) != 0)))) || (mtmp->mhp < mtmp->mhpmax)))) {
    mtmp->mstrategy = uVar6 & 0xdfffffff;
  }
  quest_stat_check(mtmp);
  if (((*(uint *)&mtmp->field_0x60 >> 0x12 & 1) == 0) || ((mtmp->mstrategy & 0x30000000) != 0)) {
    if (((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) &&
       ((u.umonnum == u.umonster || (bVar5 = dmgtype(youmonst.data,0x24), bVar5 == '\0')))) {
      newsym((int)mtmp->mx,(int)mtmp->my);
    }
    if ((*(uint *)&mtmp->field_0x60 >> 0x12 & 1) == 0) {
      return 0;
    }
    if ((*(uint *)&mtmp->field_0x60 >> 0x13 & 1) != 0) {
      return 0;
    }
    if ((mtmp->mstrategy & 0x10000000U) != 0) {
      bVar5 = monnear(mtmp,(int)u.ux,(int)u.uy);
      if (bVar5 != '\0') {
        quest_talk(mtmp);
        return 0;
      }
      return 0;
    }
    return 0;
  }
  if ((*(uint *)&mtmp->field_0x60 >> 0x13 & 1) != 0) {
    if (((((viz_array[mtmp->my][mtmp->mx] & 1U) == 0) ||
         (iVar8 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), 100 < iVar8)) ||
        ((((u.uprops[0x13].extrinsic != 0 || u.uprops[0x13].intrinsic != 0 &&
           (u.uprops[0x13].blocked == 0)) &&
          ((mtmp->data != mons + 0xb4 ||
           (uVar6 = mt_random(),
           (uVar6 * -0x33333333 >> 1 | (uint)((uVar6 * -0x33333333 & 1) != 0) << 0x1f) < 0x1999999a)
           ))) || (((mtmp->data == mons + 0xb7 || ((byte)(mtmp->data->mlet | 2U) == 0xe)) &&
                   (uVar6 = mt_random(),
                   0x51eb851 <
                   (uVar6 * -0x3d70a3d7 >> 1 | (uint)((uVar6 * -0x3d70a3d7 & 1) != 0) << 0x1f)))))))
       || ((((u.uprops[0x14].extrinsic == 0 && u.uprops[0x14].intrinsic == 0 &&
             (cVar2 = mtmp->data->mlet, cVar2 != '\x04')) && (cVar2 != '5')) &&
           ((uVar6 = mt_random(), 0x24924924 < uVar6 * -0x49249249 ||
            ((byte)(mtmp->m_ap_type - 1) < 2)))))) {
      if (u.uprops[0x23].intrinsic == 0) {
        return 0;
      }
      if (u.uprops[0x24].extrinsic == 0) {
        if ((u.umonnum != u.umonster) && (bVar5 = dmgtype(youmonst.data,0x24), bVar5 != '\0')) {
          return 0;
        }
        newsym((int)mtmp->mx,(int)mtmp->my);
        return 0;
      }
      return 0;
    }
    mtmp->field_0x62 = mtmp->field_0x62 & 0xf7;
  }
  wipe_engr_at(mtmp->dlevel,mtmp->mx,mtmp->my,'\x01');
  uVar6 = *(uint *)&mtmp->field_0x60;
  if ((uVar6 >> 0x15 & 1) != 0) {
    uVar7 = mt_random();
    uVar6 = *(uint *)&mtmp->field_0x60;
    if ((uVar7 * -0x3d70a3d7 >> 1 | (uint)((uVar7 * -0x3d70a3d7 & 1) != 0) << 0x1f) < 0x51eb852) {
      uVar6 = uVar6 & 0xffdfffff;
      *(uint *)&mtmp->field_0x60 = uVar6;
    }
  }
  if ((uVar6 >> 0x14 & 1) != 0) {
    uVar7 = mt_random();
    uVar6 = *(uint *)&mtmp->field_0x60;
    if ((uVar7 * -0x33333333 >> 1 | (uint)((uVar7 * -0x33333333 & 1) != 0) << 0x1f) < 0x1999999a) {
      uVar6 = uVar6 & 0xffefffff;
      *(uint *)&mtmp->field_0x60 = uVar6;
    }
  }
  if (((((uVar6 >> 0x10 & 1) != 0) &&
       (uVar6 = mt_random(), (uVar6 * -0x33333333 >> 3 | uVar6 * -0x60000000) < 0x6666667)) &&
      ((ptr->mflags1 & 0x2000000) != 0)) &&
     (((mtmp->field_0x63 & 0x20) == 0 && (((level->flags).field_0x9 & 8) == 0)))) {
    rloc(level,mtmp,'\0');
    return 0;
  }
  if ((ptr->msound == '\x0f') && (bVar5 = um_dist(mtmp->mx,mtmp->my,'\x01'), bVar5 == '\0')) {
    m_respond(mtmp);
  }
  if ((ptr == mons + 0x127) && ((viz_array[mtmp->my][mtmp->mx] & 1U) != 0)) {
    m_respond(mtmp);
  }
  if (mtmp->mhp < 1) {
    return 1;
  }
  if (((((mtmp->field_0x62 & 1) != 0) && (mtmp->mfleetim == '\0')) && (mtmp->mhp == mtmp->mhpmax))
     && (uVar6 = mt_random(), uVar6 * -0x3d70a3d7 < 0xa3d70a4)) {
    mtmp->field_0x62 = mtmp->field_0x62 & 0xfe;
  }
  set_apparxy(level,mtmp);
  if ((ptr->mflags3 & 0x1f) != 0) {
    tactics(mtmp);
  }
  distfleeck(mtmp,&local_74,&local_78,&local_7c);
  bVar5 = find_defensive(mtmp,&local_58);
  if (bVar5 == '\0') {
    bVar5 = find_misc(mtmp,&local_58);
    if (bVar5 != '\0') {
      iVar8 = use_misc(mtmp,&local_58);
      goto LAB_001ef8f1;
    }
  }
  else {
    iVar8 = use_defensive(mtmp,&local_58);
LAB_001ef8f1:
    if (iVar8 != 0) {
      return 1;
    }
  }
  iVar8 = local_78;
  if (local_78 != 0) {
    if (((ptr->msound == '\x1c') && (iVar9 = monsndx(ptr), iVar9 != 0x10d)) &&
       (((mtmp->field_0x62 & 0x40) != 0 && ((mtmp->mtame == '\0' && ((u._1052_1_ & 1) == 0)))))) {
      if ((mtmp->mux == u.ux) && (mtmp->muy == u.uy)) {
        iVar9 = demon_talk(mtmp);
        if (iVar9 != 0) {
          return 1;
        }
      }
      else {
        if ((viz_array[mtmp->muy][mtmp->mux] & 2U) == 0) {
          pcVar11 = "It";
        }
        else {
          pcVar11 = Monnam(mtmp);
        }
        pline("%s whispers at thin air.",pcVar11);
        if (((youmonst.data)->mflags2 & 0x200) == 0) {
          mtmp->field_0x60 = mtmp->field_0x60 & 0xf5;
          pcVar11 = Amonnam(mtmp);
          pline("%s gets angry!",pcVar11);
          mtmp->field_0x62 = mtmp->field_0x62 & 0xbf;
        }
        else {
          bVar5 = tele_restrict(mtmp);
          if (bVar5 == '\0') {
            rloc(level,mtmp,'\0');
          }
        }
      }
    }
    iVar9 = monsndx(ptr);
    if ((((iVar9 == 0x10d) && ((mtmp->field_0x62 & 0x40) == 0)) && (mtmp->mtame == '\0')) &&
       (((u._1052_1_ & 1) == 0 && (mtmp->mspec_used == 0)))) {
      lVar10 = (long)u.ulevel;
      amount = lVar10 * 500;
      pcVar11 = Amonnam(mtmp);
      pcVar12 = currency(amount);
      pline("%s demands %ld %s to avoid re-arrest.",pcVar11,amount,pcVar12);
      lVar13 = bribe(mtmp);
      if (SBORROW8(lVar13,amount) == lVar13 + lVar10 * -500 < 0) {
        verbalize("Good.  Now beat it, scum!");
        mtmp->field_0x62 = mtmp->field_0x62 | 0x40;
        set_malign(mtmp);
      }
      else {
        verbalize("I said %ld!",amount);
        mtmp->mspec_used = 1000;
      }
    }
  }
  if (ptr == mons + 0x126 || ptr == mons + 0x125) {
    if (((((mtmp->field_0x62 & 0x40) != 0) && (bVar5 = in_town((int)u.ux,(int)u.uy), bVar5 != '\0'))
        && ((*(uint *)&mtmp->field_0x60 >> 0x11 & 1) != 0)) &&
       (((((youmonst.data != mons + 0x7b && youmonst.data != mons + 0x9e) &&
           (u.uprops[0xd].extrinsic == 0 && u.uprops[0xd].intrinsic == 0) ||
          (u.uprops[0xd].blocked != 0)) || ((mtmp->data->mflags1 & 0x1000000) != 0)) &&
        ((((*(uint *)&mtmp->field_0x60 >> 9 & 1) == 0 && ((u._1052_1_ & 0x22) == 0)) &&
         (((viz_array[mtmp->my][mtmp->mx] & 1U) != 0 &&
          (uVar6 = mt_random(), uVar6 * -0x55555555 < 0x55555556)))))))) {
      if ((urole.malenum == 0x15d) && (u.umonnum == u.umonster)) {
        if (flags.verbose != '\0') {
          pcVar11 = Amonnam(mtmp);
          pline("%s yells:",pcVar11);
        }
        verbalize("Hey!  You are the one from the wanted poster!");
LAB_001efc83:
        angry_guards(flags.soundok == '\0');
LAB_001efc8c:
        stop_occupation();
      }
      else {
        bVar5 = picking_lock(&local_6c,&local_70);
        if ((bVar5 == '\0') ||
           ((level->locations[local_6c][local_70].typ != '\x17' ||
            ((level->locations[local_6c][local_70].field_0x6 & 0x80) == 0)))) {
          bVar5 = is_digging();
          if (bVar5 != '\0') {
            watch_dig(mtmp,digging.pos.x,digging.pos.y,'\0');
          }
        }
        else if ((viz_array[mtmp->my][mtmp->mx] & 1U) != 0) {
          pcVar11 = Amonnam(mtmp);
          pline("%s yells:",pcVar11);
          if ((level->locations[local_6c][local_70].field_0x7 & 1) != 0) {
            verbalize("Halt, thief!  You\'re under arrest!");
            goto LAB_001efc83;
          }
          verbalize("Hey, stop picking that lock!");
          puVar1 = &level->locations[local_6c][local_70].field_0x6;
          *(uint *)puVar1 = *(uint *)puVar1 | 0x100;
          magic_map_background((xchar)local_6c,(xchar)local_70,1);
          goto LAB_001efc8c;
        }
      }
    }
  }
  else if ((ptr == mons + 0x143 || (ptr == mons + 0x32 || ptr == mons + 0x31)) &&
          (uVar6 = mt_random(), (uVar6 * -0x33333333 >> 2 | uVar6 * 0x40000000) < 0xccccccd)) {
    if (mtmp->wormno == '\0') {
      if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) goto LAB_001f023b;
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001f01b1;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001f01a8;
      }
      else {
LAB_001f01a8:
        if (ublindf == (obj *)0x0) goto LAB_001f02a5;
LAB_001f01b1:
        if (ublindf->oartifact != '\x1d') goto LAB_001f02a5;
      }
      if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
           (((youmonst.data)->mflags3 & 0x100) != 0)) && ((viz_array[mtmp->my][mtmp->mx] & 1U) != 0)
          ) && ((mtmp->data->mflags3 & 0x200) != 0)) goto LAB_001f023b;
    }
    else {
      bVar5 = worm_known(level,mtmp);
      if (bVar5 != '\0') {
LAB_001f023b:
        uVar6 = *(uint *)&mtmp->field_0x60;
        if ((((uVar6 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)
           ) {
          if ((uVar6 & 0x280) == 0) goto LAB_001f0283;
        }
        else if (((uVar6 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_001f0283:
          if ((u._1052_1_ & 0x20) == 0) {
            pcVar11 = Monnam(mtmp);
            pline("%s concentrates.",pcVar11);
          }
        }
      }
    }
LAB_001f02a5:
    if (u.uprops[0x19].blocked == 0) {
      iVar9 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy);
      if (iVar9 < 0x41) {
        pline("A wave of psychic energy pours over you!");
        if (((mtmp->field_0x62 & 0x40) == 0) ||
           ((u.uprops[0x15].extrinsic != 0 || u.uprops[0x15].intrinsic != 0 &&
            (iVar9 = resist(mtmp,'\x04',0,0), iVar9 == 0)))) {
          if (((mtmp->data->mflags1 & 0x10000) == 0) &&
             ((poVar14 = which_armor(mtmp,4), poVar14 == (obj *)0x0 ||
              (poVar14 = which_armor(mtmp,4), poVar14->otyp != 0x4f)))) {
            if (u.uprops[0x1e].intrinsic != 0) {
LAB_001f0377:
              if (ublindf != (obj *)0x0) {
LAB_001f037c:
                if (ublindf->oartifact == '\x1d') goto LAB_001f04cb;
              }
              if ((((youmonst.data != mons + 0x31 && youmonst.data != mons + 0x1e) &&
                   (u.uprops[0x19].extrinsic == 0 && u.uprops[0x19].intrinsic == 0)) &&
                   youmonst.data != mons + 0x32) || (u.uprops[0x19].blocked != 0))
              goto LAB_001f04cb;
              goto LAB_001f0524;
            }
            if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001f037c;
            if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001f0377;
LAB_001f04cb:
            if ((u.uprops[0x19].extrinsic == 0) || (u.uprops[0x19].blocked != 0)) goto LAB_001f0519;
            iVar9 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy);
            pcVar11 = "telepathy";
            if ((0x40 < iVar9) && (u.uprops[0x42].intrinsic == 0)) goto LAB_001f0530;
          }
          else {
LAB_001f0519:
            if (u.uprops[0x42].intrinsic == 0) {
LAB_001f0530:
              pcVar11 = "telepathy";
              if (u.uprops[0x42].extrinsic == 0) {
                bVar5 = match_warn_of_mon(mtmp);
                pcVar11 = "telepathy";
                if (bVar5 == '\0') {
                  if ((((((youmonst.data != mons + 0x31 && youmonst.data != mons + 0x1e) &&
                         (u.uprops[0x19].extrinsic == 0 && u.uprops[0x19].intrinsic == 0)) &&
                         youmonst.data != mons + 0x32) || (u.uprops[0x19].blocked != 0)) ||
                      (uVar6 = mt_random(), (uVar6 & 1) == 0)) &&
                     (uVar6 = mt_random(),
                     0x19999999 <
                     (uVar6 * -0x33333333 >> 1 | (uint)((uVar6 * -0x33333333 & 1) != 0) << 0x1f)))
                  goto LAB_001f06b2;
                  pcVar12 = "latent telepathy";
                  if (u.uprops[0x19].blocked != 0) {
                    pcVar12 = "mind";
                  }
                  pcVar11 = "mind";
                  if (youmonst.data == mons + 0x32) {
                    pcVar11 = pcVar12;
                  }
                  if (youmonst.data == mons + 0x31) {
                    pcVar11 = pcVar12;
                  }
                  if (youmonst.data == mons + 0x1e) {
                    pcVar11 = pcVar12;
                  }
                  if (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0) {
                    pcVar11 = pcVar12;
                  }
                }
              }
            }
            else {
LAB_001f0524:
              pcVar11 = "telepathy";
            }
          }
          pline("It locks on to your %s!",pcVar11);
          uVar6 = mt_random();
          if (ptr == mons + 0x143) {
            uVar6 = uVar6 % 10 + 10;
          }
          else {
            uVar6 = uVar6 & 3 | 4;
          }
          uVar7 = uVar6 + 1 >> 1;
          if (u.uprops[0x32].extrinsic == 0 && u.uprops[0x32].intrinsic == 0) {
            uVar7 = uVar6;
          }
          losehp(uVar7,"psychic blast",0);
          goto LAB_001f06b2;
        }
        pcVar11 = "It feels quite soothing.";
      }
      else {
        pcVar11 = "You sense a faint wave of psychic energy.";
      }
      pline(pcVar11);
    }
    else if (uarmh != (obj *)0x0) {
      pcVar11 = yname(uarmh);
      pline("You sense something being blocked by %s.",pcVar11);
    }
LAB_001f06b2:
    if (level->monlist != (monst *)0x0) {
      local_60 = mons + 0x1e;
      local_68 = mons + 0x31;
      mon = level->monlist;
      do {
        pmVar3 = mon->nmon;
        if (((((0 < mon->mhp) &&
              (((*(uint *)&mtmp->field_0x60 ^ *(uint *)&mon->field_0x60) >> 0x16 & 1) != 0)) &&
             ((mon != mtmp &&
              (((mon->data->mflags1 & 0x10000) == 0 &&
               (iVar9 = dist2((int)mtmp->mx,(int)mtmp->my,(int)mon->mx,(int)mon->my), iVar9 < 0x41))
              )))) && ((poVar14 = which_armor(mon,4), poVar14 == (obj *)0x0 ||
                       (poVar14 = which_armor(mon,4), poVar14->otyp != 0x4f)))) &&
           (((ppVar4 = mon->data,
             ppVar4 == mons + 0x32 || (ppVar4 == local_68 || ppVar4 == local_60) &&
             ((uVar6 = mt_random(), (uVar6 & 1) != 0 || (mon->mblinded != '\0')))) ||
            (uVar6 = mt_random(),
            (uVar6 * -0x33333333 >> 1 | (uint)((uVar6 * -0x33333333 & 1) != 0) << 0x1f) < 0x1999999a
            )))) {
          if ((viz_array[mon->my][mon->mx] & 2U) != 0) {
            pcVar11 = mon_nam(mon);
            pline("It locks on to %s.",pcVar11);
          }
          uVar6 = mt_random();
          iVar9 = ~(uVar6 % 0xf) + mon->mhp;
          mon->mhp = iVar9;
          if (iVar9 < 1) {
            monkilled(mon,"",0x20);
          }
          else {
            mon->field_0x62 = mon->field_0x62 & 0xf7;
          }
        }
        mon = pmVar3;
      } while (pmVar3 != (monst *)0x0);
    }
  }
  if (((((((u.uprops[0x15].extrinsic != 0 || u.uprops[0x15].intrinsic != 0) ||
           (mtmp->field_0x62 & 0x40) == 0) && (local_74 != 0)) &&
        (iVar9 = dist2((int)mtmp->mx,(int)mtmp->my,(int)mtmp->mux,(int)mtmp->muy), iVar9 < 9)) &&
       (bVar5 = attacktype(ptr,0xfe), bVar5 != '\0')) &&
      (((poVar14 = mtmp->mw, poVar14 == (obj *)0x0 || local_7c == 0 ||
        ((byte)(poVar14->oclass | 4U) != 6)) || (objects[poVar14->otyp].oc_subtyp != '\x04')))) &&
     ((mtmp->weapon_check == '\x01' &&
      ((iVar8 != 0 || (mtmp->field_0x62 & 0x80) == 0 ||
       (poVar14 = select_rwep(mtmp), poVar14 == (obj *)0x0)))))) {
    mtmp->weapon_check = '\x03';
    iVar9 = mon_wield_item(mtmp);
    if (iVar9 != 0) {
      return 0;
    }
  }
  if (ptr->mlet == '\f') {
    poVar14 = findgold(invent);
    poVar15 = findgold(mtmp->minvent);
    bVar17 = poVar14 != (obj *)0x0;
    bVar18 = poVar15 == (obj *)0x0;
  }
  else {
    bVar18 = true;
    bVar17 = false;
  }
  if ((((iVar8 != 0) && ((*(uint *)&mtmp->field_0x60 & 0x310000) == 0 && local_7c == 0)) &&
      ((((*(uint *)&mtmp->field_0x60 & 2) == 0 ||
        (uVar6 = mt_random(), 0x55555555 < uVar6 * -0x55555555)) &&
       (((bool)(ptr->mlet != '\f' | bVar17) || ((bVar18 && (uVar6 = mt_random(), (uVar6 & 1) == 0)))
        ))))) && (((ptr->mflags2 & 0x800000) == 0 || (uVar6 = mt_random(), (uVar6 & 3) != 0)))) {
    uVar6 = *(uint *)&mtmp->field_0x60;
    if ((uVar6 >> 0x1d & 1) == 0 && (u.uprops[0x15].extrinsic != 0 || u.uprops[0x15].intrinsic != 0)
       ) {
      bVar5 = on_level(&u.uz,&dungeon_topology.d_blackmarket_level);
      if (bVar5 == '\0') goto LAB_001efebb;
      uVar6 = *(uint *)&mtmp->field_0x60;
    }
    if ((uVar6 >> 0x11 & 1) == 0) {
      uVar6 = mt_random();
      if ((uVar6 & 3) == 0) goto LAB_001efebb;
      uVar6 = *(uint *)&mtmp->field_0x60;
    }
    iVar8 = 0;
    if ((uVar6 >> 0x16 & 1) == 0) goto switchD_001eff1e_default;
  }
LAB_001efebb:
  iVar8 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy);
  if ((iVar8 < 0x32) && (mtmp->mspec_used == 0)) {
    for (uVar16 = 0x10;
        (((*(char *)((long)&((permonst *)(ptr->mattk + -4))->mname + uVar16) != -1 ||
          ((*(byte *)((long)ptr->mattk + (uVar16 - 0xf)) & 0xfe) != 0xf0)) ||
         (iVar8 = castmu(mtmp,(attack *)((long)&((permonst *)(ptr->mattk + -4))->mname + uVar16),
                         '\0','\0'), iVar8 == 0)) && (uVar16 < 0x24)); uVar16 = uVar16 + 4) {
    }
  }
  iVar8 = m_move(mtmp,0);
  distfleeck(mtmp,&local_74,&local_78,&local_7c);
  switch(iVar8) {
  case 0:
  case 3:
    if ((mtmp->field_0x63 & 8) != 0) {
      if (mtmp->mhp < 1) {
        return 1;
      }
      if ((mtmp->mx == '\0') && (mtmp->my == '\0')) {
        return 1;
      }
    }
    if (((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) &&
       ((u.umonnum == u.umonster || (bVar5 = dmgtype(youmonst.data,0x24), bVar5 == '\0')))) {
      newsym((int)mtmp->mx,(int)mtmp->my);
    }
    break;
  case 1:
    if ((*(uint *)&mtmp->field_0x60 & 0xc0000) != 0x40000) {
      return 0;
    }
    if (local_78 == 0) {
      bVar5 = ranged_attk(ptr);
      iVar8 = 1;
      if ((bVar5 != '\0') || (bVar5 = find_offensive(mtmp,&local_58), bVar5 != '\0')) break;
    }
    if ((u._1052_1_ & 1) == 0) {
      return 0;
    }
    if (u.ustuck == mtmp) {
      iVar8 = mattacku(mtmp);
      return iVar8;
    }
    return 0;
  case 2:
    return 1;
  }
switchD_001eff1e_default:
  if (((mtmp->field_0x62 & 0x40) == 0) ||
     (((u.uprops[0x15].extrinsic != 0 || u.uprops[0x15].intrinsic != 0 &&
       (iVar9 = resist(mtmp,'\x04',0,0), iVar9 == 0)) &&
      (bVar5 = on_level(&u.uz,&dungeon_topology.d_blackmarket_level), bVar5 == '\0')))) {
    if (((local_74 != 0) &&
        (iVar9 = noattacks(ptr), (iVar8 != 3 && (iVar9 == 0 && local_7c == 0)) && 0 < u.uhp)) &&
       (iVar9 = mattacku(mtmp), iVar9 != 0)) {
      return 1;
    }
    if (mtmp->wormno != '\0') {
      wormhitu(mtmp);
    }
  }
  if ((((*(uint *)&mtmp->field_0x60 >> 0x13 & 1) == 0) &&
      ((*(uint *)&mtmp->field_0x60 >> 0x12 & 1) != 0)) && (local_78 != 0)) {
    quest_talk(mtmp);
  }
  if (((((local_74 != 0) && (mtmp->data->msound == '\x1d')) &&
       ((*(uint *)&mtmp->field_0x60 >> 0x16 & 1) == 0)) &&
      (((*(uint *)&mtmp->field_0x60 & 2) == 0 && ((viz_array[mtmp->my][mtmp->mx] & 1U) != 0)))) &&
     (uVar6 = mt_random(), uVar6 * -0x33333333 < 0x33333334)) {
    cuss(mtmp);
  }
  return (uint)(iVar8 == 2);
}

Assistant:

int dochug(struct monst *mtmp)
{
	const struct permonst *mdat;
	int tmp=0;
	int inrange, nearby, scared;
        struct obj *ygold = 0, *lepgold = 0;
	struct musable musable;

/*	Pre-movement adjustments	*/

	mdat = mtmp->data;

	if (mtmp->mstrategy & STRAT_ARRIVE) {
	    int res = m_arrival(mtmp);
	    if (res >= 0) return res;
	}

	/* check for waitmask status change */
	if ((mtmp->mstrategy & STRAT_WAITFORU) &&
		(m_canseeu(mtmp) || mtmp->mhp < mtmp->mhpmax))
	    mtmp->mstrategy &= ~STRAT_WAITFORU;

	/* update quest status flags */
	quest_stat_check(mtmp);

	if (!mtmp->mcanmove || (mtmp->mstrategy & STRAT_WAITMASK)) {
	    if (Hallucination) newsym(mtmp->mx,mtmp->my);
	    if (mtmp->mcanmove && (mtmp->mstrategy & STRAT_CLOSE) &&
	       !mtmp->msleeping && monnear(mtmp, u.ux, u.uy))
		quest_talk(mtmp);	/* give the leaders a chance to speak */
	    return 0;	/* other frozen monsters can't do anything */
	}

	/* there is a chance we will wake it */
	if (mtmp->msleeping && !disturb(mtmp)) {
		if (Hallucination) newsym(mtmp->mx,mtmp->my);
		return 0;
	}

	/* not frozen or sleeping: wipe out texts written in the dust */
	wipe_engr_at(mtmp->dlevel, mtmp->mx, mtmp->my, 1);

	/* confused monsters get unconfused with small probability */
	if (mtmp->mconf && !rn2(50)) mtmp->mconf = 0;

	/* stunned monsters get un-stunned with larger probability */
	if (mtmp->mstun && !rn2(10)) mtmp->mstun = 0;

	/* some monsters teleport */
	if (mtmp->mflee && !rn2(40) && can_teleport(mdat) && !mtmp->iswiz &&
	    !level->flags.noteleport) {
		rloc(level, mtmp, FALSE);
		return 0;
	}
	if (mdat->msound == MS_SHRIEK && !um_dist(mtmp->mx, mtmp->my, 1))
	    m_respond(mtmp);
	if (mdat == &mons[PM_MEDUSA] && couldsee(mtmp->mx, mtmp->my))
	    m_respond(mtmp);
	if (mtmp->mhp <= 0) return 1; /* m_respond gaze can kill medusa */

	/* fleeing monsters might regain courage */
	if (mtmp->mflee && !mtmp->mfleetim
	   && mtmp->mhp == mtmp->mhpmax && !rn2(25)) mtmp->mflee = 0;

	set_apparxy(level, mtmp);
	/* Must be done after you move and before the monster does.  The
	 * set_apparxy() call in m_move() doesn't suffice since the variables
	 * inrange, etc. all depend on stuff set by set_apparxy().
	 */

	/* Monsters that want to acquire things */
	/* may teleport, so do it before inrange is set */
	if (is_covetous(mdat)) tactics(mtmp);

	/* check distance and scariness of attacks */
	distfleeck(mtmp,&inrange,&nearby,&scared);

	if (find_defensive(mtmp, &musable)) {
		if (use_defensive(mtmp, &musable) != 0)
			return 1;
	} else if (find_misc(mtmp, &musable)) {
		if (use_misc(mtmp, &musable) != 0)
			return 1;
	}

	/* Demonic Blackmail! */
	if (nearby && mdat->msound == MS_BRIBE &&
	    monsndx(mdat) != PM_PRISON_GUARD &&
	    mtmp->mpeaceful && !mtmp->mtame && !u.uswallow) {
		if (mtmp->mux != u.ux || mtmp->muy != u.uy) {
			pline("%s whispers at thin air.",
			    cansee(mtmp->mux, mtmp->muy) ? Monnam(mtmp) : "It");

			if (is_demon(youmonst.data)) {
			  /* "Good hunting, brother" */
			    if (!tele_restrict(mtmp)) rloc(level, mtmp, FALSE);
			} else {
			    mtmp->minvis = mtmp->perminvis = 0;
			    /* Why?  For the same reason in real demon talk */
			    pline("%s gets angry!", Amonnam(mtmp));
			    mtmp->mpeaceful = 0;
			    /* since no way is an image going to pay it off */
			}
		} else if (demon_talk(mtmp)) return 1;	/* you paid it off */
	}

	/* Prison guard extortion */
	if (nearby && monsndx(mdat) == PM_PRISON_GUARD &&
	    !mtmp->mpeaceful && !mtmp->mtame && !u.uswallow && !mtmp->mspec_used) {
	    long gdemand = 500 * u.ulevel;
	    long goffer = 0;

	    pline("%s demands %ld %s to avoid re-arrest.",
		  Amonnam(mtmp), gdemand, currency(gdemand));
	    if ((goffer = bribe(mtmp)) >= gdemand) {
		verbalize("Good.  Now beat it, scum!");
		mtmp->mpeaceful = 1;
		set_malign(mtmp);
	    } else {
		verbalize("I said %ld!", gdemand);
		mtmp->mspec_used = 1000;
	    }
	}

	/* the watch will look around and see if you are up to no good :-) */
	if (mdat == &mons[PM_WATCHMAN] || mdat == &mons[PM_WATCH_CAPTAIN])
		watch_on_duty(mtmp);

	/* [DS] Cthulhu also uses psychic blasts. */
	else if ((is_mind_flayer(mdat) || mdat == &mons[PM_CTHULHU]) && !rn2(20)) {
		struct monst *m2, *nmon = NULL;

		if (canseemon(level, mtmp))
			pline("%s concentrates.", Monnam(mtmp));

		if (BTelepat) {
			if (uarmh)
				pline("You sense something being blocked by %s.",
				      yname(uarmh));
			goto toofar;
		}
		if (distu(mtmp->mx, mtmp->my) > BOLT_LIM * BOLT_LIM) {
			pline("You sense a faint wave of psychic energy.");
			goto toofar;
		}
		pline("A wave of psychic energy pours over you!");
		if (mtmp->mpeaceful &&
		    (!Conflict || resist(mtmp, RING_CLASS, 0, 0)))
			pline("It feels quite soothing.");
		else {
			boolean m_sen = sensemon(mtmp);

			if (m_sen || (Blind_telepat && rn2(2)) || !rn2(10)) {
				int dmg;
				pline("It locks on to your %s!",
					m_sen ? "telepathy" :
					Blind_telepat ? "latent telepathy" : "mind");
				dmg = (mdat == &mons[PM_CTHULHU]) ?
					rn1(10, 10) :
					rn1(4, 4);
				if (Half_spell_damage) dmg = (dmg+1) / 2;
				losehp(dmg, "psychic blast", KILLED_BY_AN);
			}
		}
toofar:
		for (m2=level->monlist; m2; m2 = nmon) {
			nmon = m2->nmon;
			if (DEADMONSTER(m2)) continue;
			if (m2->mpeaceful == mtmp->mpeaceful) continue;
			if (mindless(m2->data)) continue;
			if (m2 == mtmp) continue;
			if (dist2(mtmp->mx, mtmp->my, m2->mx, m2->my) >
			    BOLT_LIM * BOLT_LIM)
				continue;
			if (which_armor(m2, W_ARMH) &&
			    which_armor(m2, W_ARMH)->otyp == TINFOIL_HAT)
				continue;
			if ((telepathic(m2->data) &&
			    (rn2(2) || m2->mblinded)) || !rn2(10)) {
				if (cansee(m2->mx, m2->my))
				    pline("It locks on to %s.", mon_nam(m2));
				m2->mhp -= rnd(15);
				if (m2->mhp <= 0)
				    monkilled(m2, "", AD_DRIN);
				else
				    m2->msleeping = 0;
			}
		}
	}

	/* If monster is nearby you, and has to wield a weapon, do so.   This
	 * costs the monster a move, of course.
	 */
	if ((!mtmp->mpeaceful || Conflict) && inrange &&
	   dist2(mtmp->mx, mtmp->my, mtmp->mux, mtmp->muy) <= 8
	   && attacktype(mdat, AT_WEAP)) {
	    struct obj *mw_tmp;

	    /* The scared check is necessary.  Otherwise a monster that is
	     * one square near the player but fleeing into a wall would keep	
	     * switching between pick-axe and weapon.  If monster is stuck
	     * in a trap, prefer ranged weapon (wielding is done in thrwmu).
	     * This may cost the monster an attack, but keeps the monster
	     * from switching back and forth if carrying both.
	     */
	    mw_tmp = MON_WEP(mtmp);
	    if (!(scared && mw_tmp && is_pick(mw_tmp)) &&
		mtmp->weapon_check == NEED_WEAPON &&
		!(mtmp->mtrapped && !nearby && select_rwep(mtmp))) {
		mtmp->weapon_check = NEED_HTH_WEAPON;
		if (mon_wield_item(mtmp) != 0) return 0;
	    }
	}

/*	Now the actual movement phase	*/

        if (mdat->mlet == S_LEPRECHAUN) {
	    ygold = findgold(invent);
	    lepgold = findgold(mtmp->minvent);
	}

	if (!nearby || mtmp->mflee || scared ||
	   mtmp->mconf || mtmp->mstun || (mtmp->minvis && !rn2(3)) ||
	   (mdat->mlet == S_LEPRECHAUN && !ygold && (lepgold || rn2(2))) ||
	   (is_wanderer(mdat) && !rn2(4)) ||
	   (Conflict && !mtmp->iswiz && !Is_blackmarket(&u.uz)) ||
	   (!mtmp->mcansee && !rn2(4)) || mtmp->mpeaceful) {
		/* Possibly cast an undirected spell if not attacking you */
		/* note that most of the time castmu() will pick a directed
		   spell and do nothing, so the monster moves normally */
		/* arbitrary distance restriction to keep monster far away
		   from you from having cast dozens of sticks-to-snakes
		   or similar spells by the time you reach it */
		if (dist2(mtmp->mx, mtmp->my, u.ux, u.uy) <= 49 && !mtmp->mspec_used) {
		    const struct attack *a;

		    for (a = &mdat->mattk[0]; a < &mdat->mattk[NATTK]; a++) {
			if (a->aatyp == AT_MAGC && (a->adtyp == AD_SPEL || a->adtyp == AD_CLRC)) {
			    if (castmu(mtmp, a, FALSE, FALSE)) {
				break;
			    }
			}
		    }
		}

		tmp = m_move(mtmp, 0);
		distfleeck(mtmp,&inrange,&nearby,&scared);	/* recalc */

		switch (tmp) {
		    case 0:	/* no movement, but it can still attack you */
		    case 3:	/* absolutely no movement */
				/* for pets, case 0 and 3 are equivalent */
			/* vault guard might have vanished */
			if (mtmp->isgd && (mtmp->mhp < 1 ||
					    (mtmp->mx == 0 && mtmp->my == 0)))
			    return 1;	/* behave as if it died */
			/* During hallucination, monster appearance should
			 * still change - even if it doesn't move.
			 */
			if (Hallucination) newsym(mtmp->mx,mtmp->my);
			break;
		    case 1:	/* monster moved */
			/* Maybe it stepped on a trap and fell asleep... */
			if (mtmp->msleeping || !mtmp->mcanmove) return 0;
			if (!nearby &&
			  (ranged_attk(mdat) || find_offensive(mtmp, &musable)))
			    break;
 			else if (u.uswallow && mtmp == u.ustuck) {
			    /* a monster that's digesting you can move at the
			     * same time -dlc
			     */
			    return mattacku(mtmp);
			} else
				return 0;
			/*NOTREACHED*/
			break;
		    case 2:	/* monster died */
			return 1;
		}
	}

/*	Now, attack the player if possible - one attack set per monst	*/

	if (!mtmp->mpeaceful ||
	    (Conflict && !resist(mtmp, RING_CLASS, 0, 0) &&
	     !Is_blackmarket(&u.uz))) {
	    if (inrange && !noattacks(mdat) && u.uhp > 0 && !scared && tmp != 3)
		if (mattacku(mtmp)) return 1; /* monster died (e.g. exploded) */

	    if (mtmp->wormno) wormhitu(mtmp);
	}
	/* special speeches for quest monsters */
	if (!mtmp->msleeping && mtmp->mcanmove && nearby)
	    quest_talk(mtmp);
	/* extra emotional attack for vile monsters */
	if (inrange && mtmp->data->msound == MS_CUSS && !mtmp->mpeaceful &&
		couldsee(mtmp->mx, mtmp->my) && !mtmp->minvis && !rn2(5))
	    cuss(mtmp);

	return tmp == 2;
}